

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

void __thiscall
prometheus::Gateway::Gateway
          (Gateway *this,string *host,string *port,string *jobname,Labels *labels,string *username,
          string *password,seconds timeout)

{
  SetupAdapter local_88;
  function<void_(void_*)> local_60;
  string *local_40;
  string *username_local;
  Labels *labels_local;
  string *jobname_local;
  string *port_local;
  string *host_local;
  Gateway *this_local;
  seconds timeout_local;
  
  this_local = (Gateway *)timeout.__r;
  local_40 = username;
  username_local = (string *)labels;
  labels_local = (Labels *)jobname;
  jobname_local = port;
  port_local = host;
  host_local = &this->jobUri_;
  anon_unknown_2::SetupAdapter::SetupAdapter(&local_88,username,password,timeout);
  ::std::function<void(void*)>::function<prometheus::(anonymous_namespace)::SetupAdapter,void>
            ((function<void(void*)> *)&local_60,&local_88);
  Gateway(this,host,port,&local_60,(string *)labels_local,(Labels *)username_local);
  ::std::function<void_(void_*)>::~function(&local_60);
  anon_unknown_2::SetupAdapter::~SetupAdapter(&local_88);
  return;
}

Assistant:

Gateway::Gateway(const std::string& host, const std::string& port,
                 const std::string& jobname, const Labels& labels,
                 const std::string& username, const std::string& password,
                 std::chrono::seconds timeout)
    : Gateway(host, port, SetupAdapter{username, password, timeout}, jobname,
              labels) {}